

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall
libtorrent::dht::node::get_item
          (node *this,sha1_hash *target,function<void_(const_libtorrent::dht::item_&)> *f)

{
  dht_observer *pdVar1;
  int iVar2;
  difference_type in_RCX;
  span<const_char> in;
  shared_ptr<libtorrent::dht::get_item> ta;
  undefined1 local_81;
  _Any_data local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  long *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  
  pdVar1 = this->m_observer;
  if (pdVar1 != (dht_observer *)0x0) {
    iVar2 = (**(pdVar1->super_dht_logger)._vptr_dht_logger)(pdVar1,1);
    if ((char)iVar2 != '\0') {
      pdVar1 = this->m_observer;
      in.m_len = in_RCX;
      in.m_ptr = (char *)0x14;
      aux::to_hex_abi_cxx11_((string *)&local_80,(aux *)target,in);
      (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
                (pdVar1,1,"starting get for [ hash: %s ]",local_80._M_unused._M_object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_unused._0_8_ != &local_70) {
        operator_delete(local_80._M_unused._M_object,(ulong)(local_70._M_allocated_capacity + 1));
      }
    }
  }
  ::std::function<void_(const_libtorrent::dht::item_&)>::function
            ((function<void_(const_libtorrent::dht::item_&)> *)&local_80,f);
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  ::std::__shared_ptr<libtorrent::dht::get_item,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<libtorrent::dht::get_item>,libtorrent::dht::node&,libtorrent::digest32<160l>const&,std::_Bind<std::function<void(libtorrent::dht::item_const&)>(std::_Placeholder<1>)>,std::function<void(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&)>>
            ((__shared_ptr<libtorrent::dht::get_item,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (allocator<libtorrent::dht::get_item> *)&local_81,this,target,
             (_Bind<std::function<void_(const_libtorrent::dht::item_&)>_(std::_Placeholder<1>)> *)
             &local_80,
             (function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
              *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((code *)local_70._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_70._M_allocated_capacity)(&local_80,&local_80,3);
  }
  (**(code **)(*local_58 + 0x18))();
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void node::get_item(sha1_hash const& target, std::function<void(item const&)> f)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		m_observer->log(dht_logger::node, "starting get for [ hash: %s ]"
			, aux::to_hex(target).c_str());
	}
#endif

	auto ta = std::make_shared<dht::get_item>(*this, target
		, std::bind(f, _1), find_data::nodes_callback());
	ta->start();
}